

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O3

mdef_t * mdef_init(char *mdeffile,int32 breport)

{
  uint uVar1;
  uint uVar2;
  int16 *piVar3;
  uint16 *puVar4;
  undefined8 uVar5;
  glist_t pgVar6;
  mdef_t *pmVar7;
  int iVar8;
  int32 iVar9;
  int iVar10;
  int iVar11;
  FILE *__stream;
  char *pcVar12;
  hash_table_t *phVar13;
  ciphone_t *pcVar14;
  phone_t *ppVar15;
  uint16 **ppuVar16;
  ph_lc_t ***ppppVar17;
  void *pvVar18;
  long lVar19;
  int16 *piVar20;
  glist_t g;
  int16 iVar21;
  undefined4 uVar22;
  ulong uVar23;
  int16 *piVar24;
  long lVar25;
  uint uVar26;
  uint size;
  word_posn_t wpos;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  void *pvVar32;
  undefined1 auVar33 [16];
  int32 wlen;
  int32 id;
  int32 n;
  char buf [1024];
  int32 id_1;
  char tag [1024];
  int local_c7c;
  mdef_t *local_c78;
  int local_c6c;
  hash_table_t *local_c68;
  uint local_c5c;
  long local_c58;
  uint local_c4c;
  void *local_c48;
  void *local_c40;
  undefined4 local_c38;
  byte local_838;
  char cStack_837;
  undefined1 uStack_836;
  int iStack_835;
  char local_438;
  char cStack_437;
  char cStack_436;
  char cStack_435;
  char cStack_434;
  char cStack_433;
  char cStack_432;
  char cStack_431;
  char cStack_430;
  char cStack_42f;
  char cStack_42e;
  char cStack_42d;
  char cStack_42c;
  char cStack_42b;
  char cStack_42a;
  char cStack_429;
  
  if (mdeffile == (char *)0x0) {
    pcVar12 = "No mdef-file\n";
    lVar19 = 0x200;
LAB_00106519:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c",
            lVar19,pcVar12);
  }
  else {
    if (breport != 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
              ,0x203,"Reading model definition: %s\n",mdeffile);
    }
    local_c78 = (mdef_t *)
                __ckd_calloc__(1,0x60,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                               ,0x205);
    __stream = fopen(mdeffile,"r");
    if (__stream == (FILE *)0x0) {
      err_msg_system(ERR_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                     ,0x208,"Failed to open mdef file \'%s\' for reading",mdeffile);
      goto LAB_0010658c;
    }
    do {
      pcVar12 = fgets((char *)&local_c38,0x400,__stream);
      if (pcVar12 == (char *)0x0) {
        pcVar12 = "Empty file: %s\n";
        lVar19 = 0x20b;
        goto LAB_00106561;
      }
    } while ((char)local_c38 == '#');
    if ((local_c38 == 0x46444d42) || (local_c38 == 0x424d4446)) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
              ,0x210,"Found byte-order mark %.4s, assuming this is a binary mdef file\n",&local_c38)
      ;
      fclose(__stream);
      ckd_free(local_c78);
      return (mdef_t *)0x0;
    }
    local_c68 = (hash_table_t *)mdeffile;
    if (local_c38._2_1_ != '3' || (short)local_c38 != 0x2e30) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
              ,0x217,"Version error: Expecting %s, but read %s\n","0.3",&local_c38);
      goto LAB_0010658c;
    }
    local_c78->n_ci_sen = -1;
    local_c78->n_sen = -1;
    local_c78->n_tmat = -1;
    uVar26 = 0xffffffff;
    uVar31 = 0xffffffff;
    uVar28 = 0xffffffff;
    do {
      do {
        do {
          pcVar12 = fgets((char *)&local_c38,0x400,__stream);
          if (pcVar12 == (char *)0x0) {
            pcVar12 = "Incomplete header\n";
            lVar19 = 0x222;
            goto LAB_00106519;
          }
        } while ((char)local_c38 == '#');
        iVar8 = __isoc99_sscanf(&local_c38,"%d %s",&local_c4c,&local_438);
        pmVar7 = local_c78;
        if ((iVar8 != 2) || ((int)local_c4c < 0)) {
          pcVar12 = "Error in header: %s\n";
          mdeffile = (char *)&local_c38;
          lVar19 = 0x225;
          goto LAB_00106561;
        }
        size = local_c4c;
        uVar30 = uVar31;
        uVar29 = uVar28;
        if (((CONCAT13(cStack_432,CONCAT12(cStack_433,CONCAT11(cStack_434,cStack_435))) != 0x657361
              || CONCAT13(cStack_435,CONCAT12(cStack_436,CONCAT11(cStack_437,local_438))) !=
                 0x61625f6e) &&
            (size = uVar26, uVar30 = local_c4c,
            CONCAT11(cStack_433,cStack_434) != 0x69 ||
            CONCAT13(cStack_435,CONCAT12(cStack_436,CONCAT11(cStack_437,local_438))) != 0x72745f6e))
           && (uVar30 = uVar31, uVar29 = local_c4c,
              CONCAT13(cStack_42d,CONCAT12(cStack_42e,CONCAT11(cStack_42f,cStack_430))) != 0x70616d
              || CONCAT17(cStack_431,
                          CONCAT16(cStack_432,
                                   CONCAT15(cStack_433,
                                            CONCAT14(cStack_434,
                                                     CONCAT13(cStack_435,
                                                              CONCAT12(cStack_436,
                                                                       CONCAT11(cStack_437,local_438
                                                                               ))))))) !=
                 0x5f65746174735f6e)) {
          auVar33[0] = -(local_438 == 'n');
          auVar33[1] = -(cStack_437 == '_');
          auVar33[2] = -(cStack_436 == 't');
          auVar33[3] = -(cStack_435 == 'i');
          auVar33[4] = -(cStack_434 == 'e');
          auVar33[5] = -(cStack_433 == 'd');
          auVar33[6] = -(cStack_432 == '_');
          auVar33[7] = -(cStack_431 == 'c');
          auVar33[8] = -(cStack_430 == 'i');
          auVar33[9] = -(cStack_42f == '_');
          auVar33[10] = -(cStack_42e == 's');
          auVar33[0xb] = -(cStack_42d == 't');
          auVar33[0xc] = -(cStack_42c == 'a');
          auVar33[0xd] = -(cStack_42b == 't');
          auVar33[0xe] = -(cStack_42a == 'e');
          auVar33[0xf] = -(cStack_429 == '\0');
          if ((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar33[0xf] >> 7) << 0xf) == 0xffff) {
            local_c78->n_ci_sen = local_c4c;
            uVar29 = uVar28;
          }
          else if (CONCAT17(cStack_42c,
                            CONCAT16(cStack_42d,
                                     CONCAT15(cStack_42e,
                                              CONCAT14(cStack_42f,
                                                       CONCAT13(cStack_430,
                                                                CONCAT12(cStack_431,
                                                                         CONCAT11(cStack_432,
                                                                                  cStack_433)))))))
                   == 0x65746174735f64 &&
                   CONCAT17(cStack_431,
                            CONCAT16(cStack_432,
                                     CONCAT15(cStack_433,
                                              CONCAT14(cStack_434,
                                                       CONCAT13(cStack_435,
                                                                CONCAT12(cStack_436,
                                                                         CONCAT11(cStack_437,
                                                                                  local_438)))))))
                   == 0x735f646569745f6e) {
            local_c78->n_sen = local_c4c;
            uVar29 = uVar28;
          }
          else {
            if (CONCAT13(cStack_42d,CONCAT12(cStack_42e,CONCAT11(cStack_42f,cStack_430))) !=
                0x74616d ||
                CONCAT17(cStack_431,
                         CONCAT16(cStack_432,
                                  CONCAT15(cStack_433,
                                           CONCAT14(cStack_434,
                                                    CONCAT13(cStack_435,
                                                             CONCAT12(cStack_436,
                                                                      CONCAT11(cStack_437,local_438)
                                                                     )))))) != 0x745f646569745f6e) {
              pcVar12 = "Unknown header line: %s\n";
              mdeffile = (char *)&local_c38;
              lVar19 = 0x234;
              goto LAB_00106561;
            }
            local_c78->n_tmat = local_c4c;
            uVar29 = uVar28;
          }
        }
        uVar26 = size;
        uVar31 = uVar30;
        uVar28 = uVar29;
      } while (((int)(size | uVar30 | uVar29) < 0) || (uVar1 = local_c78->n_ci_sen, (int)uVar1 < 0))
      ;
      uVar2 = local_c78->n_sen;
      uVar23 = (ulong)uVar2;
    } while (((int)uVar2 < 0) || (iVar8 = local_c78->n_tmat, iVar8 < 0));
    if ((((uVar2 < uVar1) || (size == 0)) || (uVar1 == 0)) || (iVar8 == 0)) {
      pcVar12 = "%s: Error in header\n";
      lVar19 = 0x23a;
      mdeffile = (char *)local_c68;
LAB_00106561:
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
              ,lVar19,pcVar12,mdeffile);
      goto LAB_0010658c;
    }
    if (size < 0x7fff) {
      uVar30 = uVar30 + size;
      if (uVar30 < 0x7fffffff) {
        if (uVar2 < 0x7fff) {
          if (iVar8 != 0x7fffffff) {
            local_c78->n_emit_state = uVar29 / uVar30 - 1;
            if ((uVar29 / uVar30) * uVar30 == uVar29) {
              local_c78->n_ciphone = size;
              local_c5c = size;
              phVar13 = hash_table_new(size,0);
              pmVar7->ciphone_ht = phVar13;
              local_c48 = (void *)(ulong)size;
              pcVar14 = (ciphone_t *)
                        __ckd_calloc__((size_t)(ulong)size,0x10,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                       ,0x252);
              pmVar7->ciphone = pcVar14;
              pmVar7->n_phone = uVar30;
              ppVar15 = (phone_t *)
                        __ckd_calloc__((ulong)uVar30,0x14,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                       ,0x256);
              pmVar7->phone = ppVar15;
              ppuVar16 = (uint16 **)
                         __ckd_calloc_2d__((long)pmVar7->n_phone,(long)pmVar7->n_emit_state,2,
                                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                           ,0x259);
              pmVar7->sseq = ppuVar16;
              ppppVar17 = (ph_lc_t ***)
                          __ckd_calloc_2d__(4,(long)pmVar7->n_ciphone,8,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                            ,0x25d);
              pmVar7->wpos_ci_lclist = ppppVar17;
              pvVar32 = (void *)0x0;
              do {
                do {
                  pcVar12 = fgets((char *)&local_c38,0x400,__stream);
                  pmVar7 = local_c78;
                  if (pcVar12 == (char *)0x0) {
                    pcVar12 = "Premature EOF reading CIphone %d\n";
                    lVar19 = 0x267;
                    uVar23 = (ulong)pvVar32 & 0xffffffff;
                    goto LAB_00106585;
                  }
                } while ((char)local_c38 == '#');
                iVar8 = __isoc99_sscanf(&local_c38,"%s%n",&local_838,&local_c7c);
                if (iVar8 != 1) {
                  pcVar12 = "Missing base phone name: %s\n";
                  mdeffile = (char *)&local_c38;
                  lVar19 = 0x146;
                  goto LAB_00106561;
                }
                pcVar12 = (char *)(long)local_c7c;
                iVar9 = hash_table_lookup_int32(pmVar7->ciphone_ht,(char *)&local_838,&local_c6c);
                if ((-1 < iVar9) && (-1 < local_c6c)) {
                  pcVar12 = "Duplicate base phone: %s\n";
                  mdeffile = (char *)&local_c38;
                  lVar19 = 0x14c;
                  goto LAB_00106561;
                }
                local_c68 = (hash_table_t *)pcVar12;
                if ((long)pmVar7->n_ciphone <= (long)pvVar32) {
                  __assert_fail("p < m->n_ciphone",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                ,0x65,"void ciphone_add(mdef_t *, char *, int)");
                }
                pcVar12 = __ckd_salloc__((char *)&local_838,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                         ,0x67);
                local_c58 = (long)pvVar32 * 0x10;
                pmVar7->ciphone[(long)pvVar32].name = pcVar12;
                pvVar18 = hash_table_enter(pmVar7->ciphone_ht,pcVar12,pvVar32);
                local_c40 = pvVar32;
                if (pvVar18 != pvVar32) {
                  mdeffile = *(char **)((long)&local_c78->ciphone->name + local_c58);
                  pcVar12 = "hash_table_enter(%s) failed; duplicate CIphone?\n";
                  lVar19 = 0x6b;
                  goto LAB_00106561;
                }
                pcVar12 = (char *)((long)&local_c38 + (long)local_c68);
                iVar8 = 3;
                do {
                  iVar10 = __isoc99_sscanf(pcVar12,"%s%n",&local_838,&local_c7c);
                  if ((iVar10 != 1) || (CONCAT11(cStack_837,local_838) != 0x2d)) {
                    pcVar12 = "Bad context info for base phone: %s\n";
                    mdeffile = (char *)&local_c38;
                    lVar19 = 0x156;
                    goto LAB_00106561;
                  }
                  pcVar12 = pcVar12 + local_c7c;
                  iVar8 = iVar8 + -1;
                } while (iVar8 != 0);
                iVar8 = __isoc99_sscanf(pcVar12,"%s%n",&local_838,&local_c7c);
                pvVar32 = local_c40;
                pmVar7 = local_c78;
                if (iVar8 != 1) {
                  pcVar12 = "Missing filler attribute field: %s\n";
                  mdeffile = (char *)&local_c38;
                  lVar19 = 0x15c;
                  goto LAB_00106561;
                }
                lVar19 = (long)local_c7c;
                if (iStack_835 == 0x72656c &&
                    CONCAT13((undefined1)iStack_835,
                             CONCAT12(uStack_836,CONCAT11(cStack_837,local_838))) == 0x6c6c6966) {
                  uVar22 = 1;
                }
                else {
                  uVar22 = 0;
                  if (CONCAT13((undefined1)iStack_835,
                               CONCAT12(uStack_836,CONCAT11(cStack_837,local_838))) != 0x612f6e) {
                    pcVar12 = "Bad filler attribute field: %s\n";
                    mdeffile = (char *)&local_c38;
                    lVar19 = 0x163;
                    goto LAB_00106561;
                  }
                }
                *(undefined4 *)((long)&local_c78->ciphone->filler + local_c58) = uVar22;
                iVar8 = (int)local_c40;
                triphone_add(local_c78,iVar8,-1,-1,WORD_POSN_UNDEFINED,iVar8);
                parse_tmat_senmap(pmVar7,(char *)&local_c38,
                                  (long)(pcVar12 + (lVar19 - (long)&local_c38)),iVar8);
                pmVar7 = local_c78;
                pvVar32 = (void *)((long)pvVar32 + 1);
              } while (pvVar32 != local_c48);
              iVar9 = hash_table_lookup_int32(local_c78->ciphone_ht,"SIL",(int32 *)&local_838);
              iVar21 = -1;
              if (-1 < iVar9) {
                iVar21 = CONCAT11(cStack_837,local_838);
              }
              pmVar7->sil = iVar21;
              if ((int)local_c5c < pmVar7->n_phone) {
                uVar23 = (ulong)local_c5c;
                do {
                  do {
                    pcVar12 = fgets((char *)&local_c38,0x400,__stream);
                    iVar8 = (int)uVar23;
                    if (pcVar12 == (char *)0x0) {
                      pcVar12 = "Premature EOF reading phone %d\n";
                      lVar19 = 0x26f;
LAB_00106585:
                      err_msg(ERR_FATAL,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                              ,lVar19,pcVar12,uVar23);
                      goto LAB_0010658c;
                    }
                  } while ((char)local_c38 == '#');
                  iVar10 = __isoc99_sscanf(&local_c38,"%s%n",&local_838,&local_c7c);
                  if (iVar10 != 1) {
                    pcVar12 = "Missing base phone name: %s\n";
                    mdeffile = (char *)&local_c38;
                    lVar19 = 0x178;
                    goto LAB_00106561;
                  }
                  lVar19 = (long)local_c7c;
                  iVar9 = hash_table_lookup_int32
                                    (local_c78->ciphone_ht,(char *)&local_838,&local_c6c);
                  iVar10 = -1;
                  if (-1 < iVar9) {
                    iVar10 = local_c6c;
                  }
                  local_c68 = (hash_table_t *)CONCAT44(local_c68._4_4_,iVar10);
                  if (iVar10 < 0) {
                    pcVar12 = "Unknown base phone: %s\n";
                    mdeffile = (char *)&local_c38;
                    lVar19 = 0x17d;
                    goto LAB_00106561;
                  }
                  iVar10 = __isoc99_sscanf((long)&local_c38 + lVar19,"%s%n",&local_838,&local_c7c);
                  if (iVar10 != 1) {
                    pcVar12 = "Missing left context: %s\n";
                    mdeffile = (char *)&local_c38;
                    lVar19 = 0x181;
                    goto LAB_00106561;
                  }
                  lVar25 = (long)local_c7c;
                  iVar9 = hash_table_lookup_int32
                                    (local_c78->ciphone_ht,(char *)&local_838,&local_c6c);
                  iVar10 = -1;
                  if (-1 < iVar9) {
                    iVar10 = local_c6c;
                  }
                  local_c58 = CONCAT44(local_c58._4_4_,iVar10);
                  if (iVar10 < 0) {
                    pcVar12 = "Unknown left context: %s\n";
                    mdeffile = (char *)&local_c38;
                    lVar19 = 0x185;
                    goto LAB_00106561;
                  }
                  lVar25 = (long)&local_c38 + lVar19 + lVar25;
                  iVar10 = __isoc99_sscanf(lVar25,"%s%n",&local_838,&local_c7c);
                  if (iVar10 != 1) {
                    pcVar12 = "Missing right context: %s\n";
                    mdeffile = (char *)&local_c38;
                    lVar19 = 0x189;
                    goto LAB_00106561;
                  }
                  lVar19 = (long)local_c7c;
                  iVar9 = hash_table_lookup_int32
                                    (local_c78->ciphone_ht,(char *)&local_838,&local_c6c);
                  iVar10 = -1;
                  if (-1 < iVar9) {
                    iVar10 = local_c6c;
                  }
                  if (iVar10 < 0) {
                    pcVar12 = "Unknown right  context: %s\n";
                    mdeffile = (char *)&local_c38;
                    lVar19 = 0x18d;
                    goto LAB_00106561;
                  }
                  lVar25 = lVar25 + lVar19;
                  iVar11 = __isoc99_sscanf(lVar25,"%s%n",&local_838,&local_c7c);
                  if ((iVar11 != 1) || (cStack_837 != '\0')) {
                    pcVar12 = "Missing or bad word-position spec: %s\n";
                    mdeffile = (char *)&local_c38;
                    lVar19 = 0x191;
                    goto LAB_00106561;
                  }
                  if (local_838 < 0x69) {
                    wpos = WORD_POSN_BEGIN;
                    if (local_838 != 0x62) {
                      if (local_838 != 0x65) {
LAB_001067ac:
                        pcVar12 = "Bad word-position spec: %s\n";
                        mdeffile = (char *)&local_c38;
                        lVar19 = 0x1a1;
                        goto LAB_00106561;
                      }
                      wpos = WORD_POSN_END;
                    }
                  }
                  else if (local_838 == 0x69) {
                    wpos = WORD_POSN_INTERNAL;
                  }
                  else {
                    if (local_838 != 0x73) goto LAB_001067ac;
                    wpos = WORD_POSN_SINGLE;
                  }
                  lVar25 = lVar25 + local_c7c;
                  iVar11 = __isoc99_sscanf(lVar25,"%s%n",&local_838,&local_c7c);
                  pmVar7 = local_c78;
                  if (iVar11 != 1) {
                    pcVar12 = "Missing filler attribute field: %s\n";
                    mdeffile = (char *)&local_c38;
                    lVar19 = 0x1a6;
                    goto LAB_00106561;
                  }
                  lVar19 = (long)local_c7c;
                  if (((iStack_835 != 0x72656c ||
                        CONCAT13((undefined1)iStack_835,
                                 CONCAT12(uStack_836,CONCAT11(cStack_837,local_838))) != 0x6c6c6966)
                      || (local_c78->ciphone[(ulong)local_c68 & 0xffffffff].filler == 0)) &&
                     ((CONCAT13((undefined1)iStack_835,
                                CONCAT12(uStack_836,CONCAT11(cStack_837,local_838))) != 0x612f6e ||
                      (local_c78->ciphone[(ulong)local_c68 & 0xffffffff].filler != 0)))) {
                    pcVar12 = "Bad filler attribute field: %s\n";
                    mdeffile = (char *)&local_c38;
                    lVar19 = 0x1ad;
                    goto LAB_00106561;
                  }
                  triphone_add(local_c78,(int)local_c68,(int)local_c58,iVar10,wpos,iVar8);
                  parse_tmat_senmap(pmVar7,(char *)&local_c38,(lVar25 + lVar19) - (long)&local_c38,
                                    iVar8);
                  uVar23 = (ulong)(iVar8 + 1U);
                } while ((int)(iVar8 + 1U) < pmVar7->n_phone);
              }
              do {
                pcVar12 = fgets((char *)&local_c38,0x400,__stream);
                if (pcVar12 == (char *)0x0) goto LAB_001062bf;
              } while ((char)local_c38 == '#');
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                      ,0x275,"Non-empty file beyond expected #phones (%d)\n",
                      (ulong)(uint)local_c78->n_phone);
LAB_001062bf:
              pmVar7 = local_c78;
              if (local_c78->n_emit_state * local_c78->n_ciphone == local_c78->n_ci_sen) {
                piVar20 = (int16 *)__ckd_calloc__((long)local_c78->n_sen,2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                                  ,0x27c);
                pmVar7->cd2cisen = piVar20;
                piVar20 = (int16 *)__ckd_calloc__((long)pmVar7->n_sen,2,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                                  ,0x27e);
                pmVar7->sen2cimap = piVar20;
                if (0 < pmVar7->n_sen) {
                  memset(piVar20,0xff,(ulong)(uint)pmVar7->n_sen * 2);
                }
                iVar8 = local_c78->n_ci_sen;
                uVar26 = local_c78->n_emit_state;
                if (0 < (long)iVar8) {
                  piVar3 = local_c78->cd2cisen;
                  uVar23 = 0;
                  do {
                    piVar3[uVar23] = (int16)uVar23;
                    piVar20[uVar23] =
                         (int16)((long)((ulong)(uint)((int)uVar23 >> 0x1f) << 0x20 |
                                       uVar23 & 0xffffffff) / (long)(int)uVar26);
                    uVar23 = uVar23 + 1;
                  } while ((long)iVar8 != uVar23);
                }
                iVar9 = local_c78->n_phone;
                pvVar32 = local_c48;
                uVar31 = local_c5c;
                while ((int)uVar31 < iVar9) {
                  if (0 < (int)uVar26) {
                    ppuVar16 = local_c78->sseq;
                    puVar4 = ppuVar16[(long)pvVar32];
                    piVar24 = &local_c78->phone[(long)pvVar32].ci;
                    piVar3 = local_c78->cd2cisen;
                    iVar21 = *piVar24;
                    uVar23 = 0;
                    do {
                      uVar27 = (ulong)((uint)puVar4[uVar23] * 2);
                      *(uint16 *)((long)piVar3 + uVar27) = ppuVar16[iVar21][uVar23];
                      iVar21 = *piVar24;
                      *(int16 *)((long)piVar20 + uVar27) = iVar21;
                      uVar23 = uVar23 + 1;
                    } while (uVar26 != uVar23);
                  }
                  pvVar32 = (void *)((long)pvVar32 + 1);
                  uVar31 = (uint)pvVar32;
                }
                uVar31 = 0;
                local_c68 = hash_table_new(iVar9,0);
                pmVar7 = local_c78;
                if (0 < local_c78->n_phone) {
                  lVar25 = 0;
                  lVar19 = 0;
                  pvVar32 = (void *)0x0;
                  do {
                    pvVar18 = hash_table_enter_bkey
                                        (local_c68,(char *)pmVar7->sseq[lVar19],
                                         (long)(int)(uVar26 * 2),pvVar32);
                    local_838 = (byte)pvVar18;
                    cStack_837 = (char)((ulong)pvVar18 >> 8);
                    uStack_836 = (undefined1)((ulong)pvVar18 >> 0x10);
                    iStack_835._0_1_ = (undefined1)((ulong)pvVar18 >> 0x18);
                    uVar31 = (int)pvVar32 + (uint)((int)pvVar32 == (int)pvVar18);
                    pvVar32 = (void *)(ulong)uVar31;
                    *(int *)((long)&pmVar7->phone->ssid + lVar25) = (int)pvVar18;
                    lVar19 = lVar19 + 1;
                    lVar25 = lVar25 + 0x14;
                  } while (lVar19 < pmVar7->n_phone);
                }
                ppuVar16 = (uint16 **)
                           __ckd_calloc_2d__((long)(int)uVar31,(long)pmVar7->n_emit_state,2,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                                             ,0x1d1);
                g = hash_table_tolist(local_c68,(int32 *)&local_838);
                pgVar6 = g;
                if (CONCAT13((undefined1)iStack_835,
                             CONCAT12(uStack_836,CONCAT11(cStack_837,local_838))) == uVar31) {
                  for (; pgVar6 != (glist_t)0x0; pgVar6 = pgVar6->next) {
                    uVar5 = *(undefined8 *)((long)(pgVar6->data).ptr + 0x10);
                    local_838 = (byte)uVar5;
                    cStack_837 = (char)((ulong)uVar5 >> 8);
                    uStack_836 = (undefined1)((ulong)uVar5 >> 0x10);
                    iStack_835._1_3_ = (undefined3)((uint)iStack_835 >> 8);
                    iStack_835._0_1_ = (undefined1)((ulong)uVar5 >> 0x18);
                    memcpy(ppuVar16[(int)uVar5],*(pgVar6->data).ptr,(long)(int)(uVar26 * 2));
                  }
                  glist_free(g);
                  pmVar7 = local_c78;
                  ckd_free_2d(local_c78->sseq);
                  pmVar7->sseq = ppuVar16;
                  pmVar7->n_sseq = uVar31;
                  hash_table_free(local_c68);
                  fclose(__stream);
                  return pmVar7;
                }
                __assert_fail("j == n_sseq",
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                              ,0x1d4,"void sseq_compress(mdef_t *)");
              }
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                      ,0x27b,"#CI-senones(%d) != #CI-phone(%d) x #emitting-states(%d)\n",
                      (ulong)(uint)local_c78->n_ci_sen,(ulong)(uint)local_c78->n_ciphone,
                      local_c78->n_emit_state);
              goto LAB_0010658c;
            }
            pcVar12 = "Header error: n_state_map not a multiple of n_ci*n_tri\n";
            lVar19 = 0x24d;
            goto LAB_00106519;
          }
          uVar22 = 0x7fffffff;
          pcVar12 = "%s: #tmats (%d) exceeds limit (%d)\n";
          lVar19 = 0x248;
          uVar23 = 0x7fffffff;
        }
        else {
          uVar22 = 0x7fff;
          pcVar12 = "%s: #senones (%d) exceeds limit (%d)\n";
          lVar19 = 0x245;
        }
      }
      else {
        uVar22 = 0x7fffffff;
        pcVar12 = "%s: #Phones (%d) exceeds limit (%d)\n";
        lVar19 = 0x242;
        uVar23 = (ulong)uVar30;
      }
    }
    else {
      uVar22 = 0x7fff;
      pcVar12 = "%s: #CI phones (%d) exceeds limit (%d)\n";
      lVar19 = 0x23f;
      uVar23 = (ulong)size;
    }
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c",
            lVar19,pcVar12,local_c68,uVar23,uVar22);
  }
LAB_0010658c:
  exit(1);
}

Assistant:

mdef_t *
mdef_init(char *mdeffile, int32 breport)
{
    FILE *fp;
    int32 n_ci, n_tri, n_map, n;
    __BIGSTACKVARIABLE__ char tag[1024], buf[1024];
    uint16 **senmap;
    int p;
    int32 s, ci, cd;
    mdef_t *m;

    if (!mdeffile)
        E_FATAL("No mdef-file\n");

    if (breport)
        E_INFO("Reading model definition: %s\n", mdeffile);

    m = (mdef_t *) ckd_calloc(1, sizeof(mdef_t));       /* freed in mdef_free */

    if ((fp = fopen(mdeffile, "r")) == NULL)
        E_FATAL_SYSTEM("Failed to open mdef file '%s' for reading", mdeffile);

    if (noncomment_line(buf, sizeof(buf), fp) < 0)
        E_FATAL("Empty file: %s\n", mdeffile);

    if (strncmp(buf, "BMDF", 4) == 0 || strncmp(buf, "FDMB", 4) == 0) {
        E_INFO
            ("Found byte-order mark %.4s, assuming this is a binary mdef file\n",
             buf);
        fclose(fp);
        ckd_free(m);
        return NULL;
    }
    if (strncmp(buf, MODEL_DEF_VERSION, strlen(MODEL_DEF_VERSION)) != 0)
        E_FATAL("Version error: Expecting %s, but read %s\n",
                MODEL_DEF_VERSION, buf);

    /* Read #base phones, #triphones, #senone mappings defined in header */
    n_ci = -1;
    n_tri = -1;
    n_map = -1;
    m->n_ci_sen = -1;
    m->n_sen = -1;
    m->n_tmat = -1;
    do {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Incomplete header\n");

        if ((sscanf(buf, "%d %s", &n, tag) != 2) || (n < 0))
            E_FATAL("Error in header: %s\n", buf);

        if (strcmp(tag, "n_base") == 0)
            n_ci = n;
        else if (strcmp(tag, "n_tri") == 0)
            n_tri = n;
        else if (strcmp(tag, "n_state_map") == 0)
            n_map = n;
        else if (strcmp(tag, "n_tied_ci_state") == 0)
            m->n_ci_sen = n;
        else if (strcmp(tag, "n_tied_state") == 0)
            m->n_sen = n;
        else if (strcmp(tag, "n_tied_tmat") == 0)
            m->n_tmat = n;
        else
            E_FATAL("Unknown header line: %s\n", buf);
    } while ((n_ci < 0) || (n_tri < 0) || (n_map < 0) ||
             (m->n_ci_sen < 0) || (m->n_sen < 0) || (m->n_tmat < 0));

    if ((n_ci == 0) || (m->n_ci_sen == 0) || (m->n_tmat == 0)
        || (m->n_ci_sen > m->n_sen))
        E_FATAL("%s: Error in header\n", mdeffile);

    /* Check typesize limits */
    if (n_ci >= MAX_INT16)
        E_FATAL("%s: #CI phones (%d) exceeds limit (%d)\n", mdeffile, n_ci,
                MAX_INT16);
    if ((int64)n_ci + n_tri >= MAX_INT32)
        E_FATAL("%s: #Phones (%d) exceeds limit (%d)\n", mdeffile,
                n_ci + n_tri, MAX_INT32);
    if (m->n_sen >= MAX_INT16)
        E_FATAL("%s: #senones (%d) exceeds limit (%d)\n", mdeffile,
                m->n_sen, MAX_INT16);
    if (m->n_tmat >= MAX_INT32) /* Comparison is always false... */
        E_FATAL("%s: #tmats (%d) exceeds limit (%d)\n", mdeffile,
                m->n_tmat, MAX_INT32);

    m->n_emit_state = (n_map / (n_ci + n_tri)) - 1;
    if ((m->n_emit_state + 1) * (n_ci + n_tri) != n_map)
        E_FATAL
            ("Header error: n_state_map not a multiple of n_ci*n_tri\n");

    /* Initialize ciphone info */
    m->n_ciphone = n_ci;
    m->ciphone_ht = hash_table_new(n_ci, HASH_CASE_YES);  /* With case-insensitive string names *//* freed in mdef_free */
    m->ciphone = (ciphone_t *) ckd_calloc(n_ci, sizeof(ciphone_t));     /* freed in mdef_free */

    /* Initialize phones info (ciphones + triphones) */
    m->n_phone = n_ci + n_tri;
    m->phone = (phone_t *) ckd_calloc(m->n_phone, sizeof(phone_t));     /* freed in mdef_free */

    /* Allocate space for state->senone map for each phone */
    senmap = ckd_calloc_2d(m->n_phone, m->n_emit_state, sizeof(**senmap));      /* freed in mdef_free */
    m->sseq = senmap;           /* TEMPORARY; until it is compressed into just the unique ones */

    /* Allocate initial space for <ci,lc,rc,wpos> -> pid mapping */
    m->wpos_ci_lclist = (ph_lc_t ***) ckd_calloc_2d(N_WORD_POSN, m->n_ciphone, sizeof(ph_lc_t *));      /* freed in mdef_free */

    /*
     * Read base phones and triphones.  They'll simply be assigned a running sequence
     * number as their "phone-id".  If the phone-id < n_ci, it's a ciphone.
     */

    /* Read base phones */
    for (p = 0; p < n_ci; p++) {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Premature EOF reading CIphone %d\n", p);
        parse_base_line(m, buf, p);
    }
    m->sil = mdef_ciphone_id(m, S3_SILENCE_CIPHONE);

    /* Read triphones, if any */
    for (; p < m->n_phone; p++) {
        if (noncomment_line(buf, sizeof(buf), fp) < 0)
            E_FATAL("Premature EOF reading phone %d\n", p);
        parse_tri_line(m, buf, p);
    }

    if (noncomment_line(buf, sizeof(buf), fp) >= 0)
        E_ERROR("Non-empty file beyond expected #phones (%d)\n",
                m->n_phone);

    /* Build CD senones to CI senones map */
    if (m->n_ciphone * m->n_emit_state != m->n_ci_sen)
        E_FATAL
            ("#CI-senones(%d) != #CI-phone(%d) x #emitting-states(%d)\n",
             m->n_ci_sen, m->n_ciphone, m->n_emit_state);
    m->cd2cisen = (int16 *) ckd_calloc(m->n_sen, sizeof(*m->cd2cisen)); /* freed in mdef_free */

    m->sen2cimap = (int16 *) ckd_calloc(m->n_sen, sizeof(*m->sen2cimap)); /* freed in mdef_free */

    for (s = 0; s < m->n_sen; s++)
        m->sen2cimap[s] = -1;
    for (s = 0; s < m->n_ci_sen; s++) { /* CI senones */
        m->cd2cisen[s] = s;
        m->sen2cimap[s] = s / m->n_emit_state;
    }
    for (p = n_ci; p < m->n_phone; p++) {       /* CD senones */
        for (s = 0; s < m->n_emit_state; s++) {
            cd = m->sseq[p][s];
            ci = m->sseq[m->phone[p].ci][s];
            m->cd2cisen[cd] = ci;
            m->sen2cimap[cd] = m->phone[p].ci;
        }
    }

    sseq_compress(m);
    fclose(fp);

    return m;
}